

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  SQUnsignedInteger *pSVar1;
  SQClass *pSVar2;
  SQObjectPtr *this_00;
  ulong uVar3;
  bool bVar4;
  
  pSVar2 = this->_class;
  uVar3 = (ulong)(pSVar2->_defaultvalues)._size;
  pSVar1 = &(pSVar2->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 - 1;
  if (*pSVar1 == 0) {
    (*(pSVar2->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
  }
  this->_class = (SQClass *)0x0;
  this_00 = this->_values;
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    SQObjectPtr::Null(this_00);
    this_00 = this_00 + 1;
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}